

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O2

iter_type __thiscall
booster::locale::util::base_num_format<wchar_t>::format_currency<true>
          (base_num_format<wchar_t> *this,iter_type out,ios_base *ios,char_type_conflict fill,
          longdouble val)

{
  uint uVar1;
  undefined1 auVar2 [12];
  int iVar3;
  moneypunct *pmVar4;
  money_put *pmVar5;
  iter_type iVar6;
  locale loc;
  
  std::locale::locale(&loc,(locale *)(ios + 0xd0));
  pmVar4 = std::use_facet<std::__cxx11::moneypunct<wchar_t,true>>(&loc);
  for (iVar3 = (**(code **)(*(long *)pmVar4 + 0x40))(pmVar4); 0 < iVar3; iVar3 = iVar3 + -1) {
    val = val * (longdouble)10.0;
  }
  uVar1 = *(uint *)(ios + 0x18);
  *(uint *)(ios + 0x18) = uVar1 | 0x200;
  pmVar5 = std::
           use_facet<std::__cxx11::money_put<wchar_t,std::ostreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>>
                     (&loc);
  auVar2 = (**(code **)(*(long *)pmVar5 + 0x10))(pmVar5,out._M_sbuf,out._8_4_ & 0xff,1,ios,fill,val)
  ;
  *(uint *)(ios + 0x18) = uVar1;
  std::locale::~locale(&loc);
  iVar6._12_4_ = 0;
  iVar6._M_sbuf = (streambuf_type *)auVar2._0_8_;
  iVar6._M_failed = (bool)auVar2[8];
  iVar6._9_3_ = auVar2._9_3_;
  return iVar6;
}

Assistant:

iter_type format_currency(iter_type out,std::ios_base &ios,char_type fill,long double val) const
    {
        std::locale loc = ios.getloc();
        int digits = std::use_facet<std::moneypunct<char_type,intl> >(loc).frac_digits();
        while(digits > 0) {
            val*=10;
            digits --;
        }
        std::ios_base::fmtflags f=ios.flags();
        ios.flags(f | std::ios_base::showbase);
        out = std::use_facet<std::money_put<char_type> >(loc).put(out,intl,ios,fill,val);
        ios.flags(f);
        return out;
    }